

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::InputFile(InputFile *this,char *fileName,int numThreads)

{
  bool bVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  _func_int *p_Var4;
  GenericInputFile *in_RDI;
  stringstream _iex_replace_s;
  int *in_stack_00000100;
  IStream *in_stack_00000108;
  GenericInputFile *in_stack_00000110;
  InputFile *in_stack_00000150;
  BaseExc *e;
  IStream *is;
  int *in_stack_000003b0;
  IStream *in_stack_000003b8;
  Header *in_stack_000003c0;
  undefined1 in_stack_0000186e;
  undefined1 in_stack_0000186f;
  Header *in_stack_00001870;
  InputStreamMutex *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  Data *in_stack_fffffffffffffdb0;
  IStream *in_stack_fffffffffffffdb8;
  InputFile *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  StdIFStream *in_stack_fffffffffffffdd0;
  string *in_stack_ffffffffffffff28;
  Header *in_stack_ffffffffffffff30;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__InputFile_0340e480;
  pp_Var2 = (_func_int **)operator_new(0x108);
  Data::Data(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  in_RDI[1]._vptr_GenericInputFile = pp_Var2;
  in_RDI[1]._vptr_GenericInputFile[0x1f] = (_func_int *)0x0;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x20) = 1;
  pvVar3 = operator_new(0x38);
  StdIFStream::StdIFStream(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_00000110,in_stack_00000108,in_stack_00000100);
  bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
  if (bVar1) {
    compatibilityInitialize(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  else {
    p_Var4 = (_func_int *)operator_new(0x38);
    InputStreamMutex::InputStreamMutex(in_stack_fffffffffffffda0);
    in_RDI[1]._vptr_GenericInputFile[0x1f] = p_Var4;
    *(void **)(in_RDI[1]._vptr_GenericInputFile[0x1f] + 0x28) = pvVar3;
    Header::readFrom(in_stack_000003c0,in_stack_000003b8,in_stack_000003b0);
    bVar1 = isNonImage(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
    if (((!bVar1) && (bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc)), !bVar1)
        ) && (bVar1 = Header::hasType((Header *)0x77ed0d), bVar1)) {
      isTiled(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
      Header::setType(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    isTiled(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
    Header::sanityCheck(in_stack_00001870,(bool)in_stack_0000186f,(bool)in_stack_0000186e);
    initialize(in_stack_00000150);
  }
  return;
}

Assistant:

InputFile::InputFile (const char fileName[], int numThreads):
    _data (new Data (numThreads))
{
    _data->_streamData = NULL;
    _data->_deleteStream=true;
    
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is = 0;
    try
    {
        is = new StdIFStream (fileName);
        readMagicNumberAndVersionField(*is, _data->version);

        //
        // compatibility to read multipart file.
        //
        if (isMultiPart(_data->version))
        {
            compatibilityInitialize(*is);
        }
        else
        {
            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            
            // fix type attribute in single part regular image types
            // (may be wrong if an old version of OpenEXR converts
            // a tiled image to scanline or vice versa)
            if(!isNonImage(_data->version)  && 
               !isMultiPart(_data->version) && 
               _data->header.hasType())
            {
                _data->header.setType(isTiled(_data->version) ? TILEDIMAGE : SCANLINEIMAGE);
            }
            
            _data->header.sanityCheck (isTiled (_data->version));

            initialize();
        }
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
         
        if ( _data && !_data->multiPartBackwardSupport  && _data->_streamData)
        {
            delete _data->_streamData;
            _data->_streamData=NULL;
        }
        
        if (_data)       delete _data;
        _data=NULL;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (is)          delete is;
        if (_data && !_data->multiPartBackwardSupport && _data->_streamData)
        {
            delete _data->_streamData;
        }
        if (_data)       delete _data;

        throw;
    }
}